

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O3

int OBJ_find_sigid_algs(int signid,int *pdig_nid,int *ppkey_nid)

{
  nid_triple *pnVar1;
  ulong uVar2;
  nid_triple *pnVar3;
  nid_triple *pnVar4;
  bool bVar5;
  
  if (signid == 0x18c) {
    pnVar3 = kTriples;
    bVar5 = true;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    pnVar4 = kTriples;
    do {
      if (uVar2 == 0x10) {
        bVar5 = false;
        goto LAB_0031d426;
      }
      pnVar3 = pnVar4 + 1;
      uVar2 = uVar2 + 1;
      pnVar1 = pnVar4 + 1;
      pnVar4 = pnVar3;
    } while (pnVar1->sign_nid != signid);
    bVar5 = uVar2 < 0x11;
  }
  if (pdig_nid != (int *)0x0) {
    *pdig_nid = pnVar3->digest_nid;
  }
  if (ppkey_nid != (int *)0x0) {
    *ppkey_nid = pnVar3->pkey_nid;
  }
LAB_0031d426:
  return (int)bVar5;
}

Assistant:

int OBJ_find_sigid_algs(int sign_nid, int *out_digest_nid, int *out_pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].sign_nid == sign_nid) {
      if (out_digest_nid != NULL) {
        *out_digest_nid = kTriples[i].digest_nid;
      }
      if (out_pkey_nid != NULL) {
        *out_pkey_nid = kTriples[i].pkey_nid;
      }
      return 1;
    }
  }

  return 0;
}